

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_vector_no_broadcast<ncnn::BinaryOp_x86_fma_functor::binary_op_mul>
               (float *ptr,float *ptr1,float *outptr,int size)

{
  int in_ECX;
  float *in_RDX;
  float *in_RSI;
  float *in_RDI;
  __m128 _outp_1;
  __m128 _b_1;
  __m128 _p_1;
  __m256 _outp;
  __m256 _b;
  __m256 _p;
  int i;
  binary_op_mul op;
  int local_174;
  float *local_168;
  float *local_160;
  float *local_158;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined4 uStack_64;
  float local_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  float local_40;
  float fStack_3c;
  float fStack_38;
  float fStack_34;
  
  local_168 = in_RDX;
  local_160 = in_RSI;
  local_158 = in_RDI;
  for (local_174 = 0; local_174 + 7 < in_ECX; local_174 = local_174 + 8) {
    local_80 = (float)*(undefined8 *)local_158;
    fStack_7c = (float)((ulong)*(undefined8 *)local_158 >> 0x20);
    fStack_78 = (float)*(undefined8 *)(local_158 + 2);
    fStack_74 = (float)((ulong)*(undefined8 *)(local_158 + 2) >> 0x20);
    fStack_70 = (float)*(undefined8 *)(local_158 + 4);
    fStack_6c = (float)((ulong)*(undefined8 *)(local_158 + 4) >> 0x20);
    fStack_68 = (float)*(undefined8 *)(local_158 + 6);
    uStack_64 = (undefined4)((ulong)*(undefined8 *)(local_158 + 6) >> 0x20);
    local_a0 = (float)*(undefined8 *)local_160;
    fStack_9c = (float)((ulong)*(undefined8 *)local_160 >> 0x20);
    fStack_98 = (float)*(undefined8 *)(local_160 + 2);
    fStack_94 = (float)((ulong)*(undefined8 *)(local_160 + 2) >> 0x20);
    fStack_90 = (float)*(undefined8 *)(local_160 + 4);
    fStack_8c = (float)((ulong)*(undefined8 *)(local_160 + 4) >> 0x20);
    fStack_88 = (float)*(undefined8 *)(local_160 + 6);
    *(ulong *)local_168 = CONCAT44(fStack_7c * fStack_9c,local_80 * local_a0);
    *(ulong *)(local_168 + 2) = CONCAT44(fStack_74 * fStack_94,fStack_78 * fStack_98);
    *(ulong *)(local_168 + 4) = CONCAT44(fStack_6c * fStack_8c,fStack_70 * fStack_90);
    *(ulong *)(local_168 + 6) = CONCAT44(uStack_64,fStack_68 * fStack_88);
    local_158 = local_158 + 8;
    local_160 = local_160 + 8;
    local_168 = local_168 + 8;
  }
  for (; local_174 + 3 < in_ECX; local_174 = local_174 + 4) {
    local_40 = (float)*(undefined8 *)local_158;
    fStack_3c = (float)((ulong)*(undefined8 *)local_158 >> 0x20);
    fStack_38 = (float)*(undefined8 *)(local_158 + 2);
    fStack_34 = (float)((ulong)*(undefined8 *)(local_158 + 2) >> 0x20);
    local_50 = (float)*(undefined8 *)local_160;
    fStack_4c = (float)((ulong)*(undefined8 *)local_160 >> 0x20);
    fStack_48 = (float)*(undefined8 *)(local_160 + 2);
    fStack_44 = (float)((ulong)*(undefined8 *)(local_160 + 2) >> 0x20);
    *(ulong *)local_168 = CONCAT44(fStack_3c * fStack_4c,local_40 * local_50);
    *(ulong *)(local_168 + 2) = CONCAT44(fStack_34 * fStack_44,fStack_38 * fStack_48);
    local_158 = local_158 + 4;
    local_160 = local_160 + 4;
    local_168 = local_168 + 4;
  }
  for (; local_174 < in_ECX; local_174 = local_174 + 1) {
    *local_168 = *local_158 * *local_160;
    local_158 = local_158 + 1;
    local_160 = local_160 + 1;
    local_168 = local_168 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_no_broadcast(const float* ptr, const float* ptr1, float* outptr, int size)
{
    const Op op;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_p, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_p, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, *ptr1);
        ptr += 1;
        ptr1 += 1;
        outptr += 1;
    }
}